

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O3

void CLI::detail::format_help(stringstream *out,string *name,string *description,size_t wid)

{
  ostream *poVar1;
  long lVar2;
  char cVar3;
  ostream *poVar4;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::operator+(&local_50,"  ",name);
  ::std::__cxx11::string::operator=((string *)name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  poVar1 = (ostream *)(out + 0x10);
  lVar2 = *(long *)(out + 0x10);
  *(long *)(out + *(long *)(lVar2 + -0x18) + 0x20) = (long)(int)wid;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(out + lVar2 + 0x28) = *(uint *)(out + lVar2 + 0x28) & 0xffffff4f | 0x20;
  ::std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  sVar5 = description->_M_string_length;
  cVar3 = (char)poVar1;
  if (sVar5 != 0) {
    if (wid <= name->_M_string_length) {
      ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar3);
      ::std::ostream::put(cVar3);
      poVar4 = (ostream *)::std::ostream::flush();
      *(long *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = (long)(int)wid;
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"",0);
      sVar5 = description->_M_string_length;
    }
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(description->_M_dataplus)._M_p,sVar5);
  }
  ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar3);
  ::std::ostream::put(cVar3);
  ::std::ostream::flush();
  return;
}

Assistant:

inline void format_help(std::stringstream &out, std::string name, std::string description, size_t wid) {
    name = "  " + name;
    out << std::setw(static_cast<int>(wid)) << std::left << name;
    if(!description.empty()) {
        if(name.length() >= wid)
            out << std::endl << std::setw(static_cast<int>(wid)) << "";
        out << description;
    }
    out << std::endl;
}